

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  char *pcVar2;
  bool local_74;
  bool local_72;
  bool local_71;
  bool term_supports_color;
  char *term;
  char *gtest_color;
  string c;
  bool stdout_is_tty_local;
  
  c.field_2._M_local_buf[0xe] = stdout_is_tty;
  std::__cxx11::string::string((string *)&gtest_color,(string *)FLAGS_gtest_color_abi_cxx11_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = String::CaseInsensitiveCStringEquals(pcVar2,"auto");
  if (bVar1) {
    pcVar2 = posix::GetEnv("TERM");
    bVar1 = String::CStringEquals(pcVar2,"xterm");
    local_71 = true;
    if (!bVar1) {
      bVar1 = String::CStringEquals(pcVar2,"xterm-color");
      local_71 = true;
      if (!bVar1) {
        bVar1 = String::CStringEquals(pcVar2,"xterm-256color");
        local_71 = true;
        if (!bVar1) {
          bVar1 = String::CStringEquals(pcVar2,"screen");
          local_71 = true;
          if (!bVar1) {
            bVar1 = String::CStringEquals(pcVar2,"screen-256color");
            local_71 = true;
            if (!bVar1) {
              bVar1 = String::CStringEquals(pcVar2,"tmux");
              local_71 = true;
              if (!bVar1) {
                bVar1 = String::CStringEquals(pcVar2,"tmux-256color");
                local_71 = true;
                if (!bVar1) {
                  bVar1 = String::CStringEquals(pcVar2,"rxvt-unicode");
                  local_71 = true;
                  if (!bVar1) {
                    bVar1 = String::CStringEquals(pcVar2,"rxvt-unicode-256color");
                    local_71 = true;
                    if (!bVar1) {
                      bVar1 = String::CStringEquals(pcVar2,"linux");
                      local_71 = true;
                      if (!bVar1) {
                        local_71 = String::CStringEquals(pcVar2,"cygwin");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_72 = false;
    if ((c.field_2._M_local_buf[0xe] & 1U) != 0) {
      local_72 = local_71;
    }
    c.field_2._M_local_buf[0xf] = local_72;
  }
  else {
    bVar1 = String::CaseInsensitiveCStringEquals(pcVar2,"yes");
    local_74 = true;
    if (!bVar1) {
      bVar1 = String::CaseInsensitiveCStringEquals(pcVar2,"true");
      local_74 = true;
      if (!bVar1) {
        bVar1 = String::CaseInsensitiveCStringEquals(pcVar2,"t");
        local_74 = true;
        if (!bVar1) {
          local_74 = String::CStringEquals(pcVar2,"1");
        }
      }
    }
    c.field_2._M_local_buf[0xf] = local_74;
  }
  std::__cxx11::string::~string((string *)&gtest_color);
  return (bool)(c.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS && !GTEST_OS_WINDOWS_MINGW
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "tmux") ||
        String::CStringEquals(term, "tmux-256color") ||
        String::CStringEquals(term, "rxvt-unicode") ||
        String::CStringEquals(term, "rxvt-unicode-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}